

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O1

QMatrix4x4 *
QOpenGLTextureBlitter::targetTransform
          (QMatrix4x4 *__return_storage_ptr__,QRectF *target,QRect *viewport)

{
  undefined4 uVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  float *pfVar8;
  QMatrix4x4 *pQVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar2 = target->xp;
  dVar3 = target->yp;
  pfVar8 = (float *)&DAT_001845e0;
  pQVar9 = __return_storage_ptr__;
  for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
    pQVar9->m[0][0] = *pfVar8;
    pfVar8 = pfVar8 + 1;
    pQVar9 = (QMatrix4x4 *)(pQVar9->m[0] + 1);
  }
  __return_storage_ptr__->m[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->m + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  __return_storage_ptr__->m[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->m + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 2) + 4) = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->m[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[3] + 3) = 0x1f3f800000;
  auVar11._0_8_ = target->w;
  auVar11._8_8_ = target->h;
  uVar1 = viewport->x2;
  uVar4 = viewport->y2;
  uVar5 = viewport->x1;
  uVar6 = viewport->y1;
  auVar13._0_8_ = (double)((uVar1 - uVar5) + 1);
  auVar13._8_8_ = (double)((uVar4 - uVar6) + 1);
  auVar12 = divpd(auVar11,auVar13);
  auVar10._0_8_ = dVar2 - (double)(int)uVar5;
  auVar10._8_8_ = -(dVar3 - (double)(int)uVar6);
  auVar11 = divpd(auVar10,auVar13);
  *(ulong *)__return_storage_ptr__->m[3] =
       CONCAT44((float)(auVar11._8_8_ + auVar11._8_8_ + (1.0 - auVar12._8_8_)),
                (float)(auVar11._0_8_ + auVar11._0_8_ + auVar12._0_8_ + -1.0));
  (__return_storage_ptr__->flagBits).super_QFlagsStorageHelper<QMatrix4x4::Flag,_4>.
  super_QFlagsStorage<QMatrix4x4::Flag>.i = 0x1f;
  __return_storage_ptr__->m[0][0] = (float)auVar12._0_8_;
  __return_storage_ptr__->m[1][1] = (float)auVar12._8_8_;
  return __return_storage_ptr__;
}

Assistant:

QMatrix4x4 QOpenGLTextureBlitter::targetTransform(const QRectF &target,
                                                  const QRect &viewport)
{
    qreal x_scale = target.width() / viewport.width();
    qreal y_scale = target.height() / viewport.height();

    const QPointF relative_to_viewport = target.topLeft() - viewport.topLeft();
    qreal x_translate = x_scale - 1 + ((relative_to_viewport.x() / viewport.width()) * 2);
    qreal y_translate = -y_scale + 1 - ((relative_to_viewport.y() / viewport.height()) * 2);

    QMatrix4x4 matrix;
    matrix(0,3) = x_translate;
    matrix(1,3) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}